

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

void __thiscall
icu_63::ReorderingBuffer::copyReorderableSuffixTo(ReorderingBuffer *this,UnicodeString *s)

{
  UnicodeString::setTo
            (s,this->reorderStart,
             (int32_t)((ulong)((long)this->limit - (long)this->reorderStart) >> 1));
  return;
}

Assistant:

void copyReorderableSuffixTo(UnicodeString &s) const {
        s.setTo(ConstChar16Ptr(reorderStart), (int32_t)(limit-reorderStart));
    }